

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O2

string * __thiscall
iutest::PrintToStrings<int,int>
          (string *__return_storage_ptr__,iutest *this,char *separate,int *v,int args)

{
  int local_34;
  string local_30;
  
  local_34 = (int)v;
  PrintToString<int>(__return_storage_ptr__,(int *)separate);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  PrintToString<int>(&local_30,&local_34);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string PrintToStrings(const char* separate, const T& v, Args... args)
{
    ::std::string str = PrintToString(v);
    str += separate;
    str += PrintToStrings(separate, args...);
    return str;
}